

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_8::DiskHandle::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  DiskHandle *this_00;
  int fromDirFd;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40 [2];
  Fault local_20;
  Fault f;
  ReplacerImpl<kj::Directory> *this_local;
  
  f.exception = (Exception *)this;
  if (((this->committed ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x4ef,FAILED,"!committed","\"already committed\"",(char (*) [18])"already committed"
              );
    this_local._7_1_ = false;
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  else {
    this_00 = this->handle;
    StringPtr::StringPtr((StringPtr *)local_40,&this->path);
    fromDirFd = AutoCloseFd::operator_cast_to_int(&this->handle->fd);
    StringPtr::StringPtr((StringPtr *)&local_50,&this->tempPath);
    this_local._7_1_ =
         tryCommitReplacement
                   (this_00,(StringPtr)local_40[0],fromDirFd,(StringPtr)local_50,
                    (this->super_Replacer<kj::Directory>).mode,(int *)0x0);
    this->committed = this_local._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool tryCommit() override {
      KJ_ASSERT(!committed, "already committed") { return false; }
      return committed = handle.tryCommitReplacement(path, handle.fd, tempPath,
                                                     Directory::Replacer<T>::mode);
    }